

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O2

void __thiscall QSslError::QSslError(QSslError *this,SslError error)

{
  _Head_base<0UL,_QSslErrorPrivate_*,_false> this_00;
  
  this_00._M_head_impl = (QSslErrorPrivate *)operator_new(0x10);
  QSslErrorPrivate::QSslErrorPrivate(this_00._M_head_impl);
  (this->d)._M_t.super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
  super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  (this_00._M_head_impl)->error = error;
  return;
}

Assistant:

QSslError::QSslError(SslError error)
    : d(new QSslErrorPrivate)
{
    d->error = error;
}